

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall Chip8::Graphics::refresh(Graphics *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int pixel;
  long lVar6;
  SDL_Rect scaled_pixel;
  
  iVar1 = SDL_RenderClear(this->_renderer);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[graphics] clear error: ",0x18);
    __s = (char *)SDL_GetError();
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107120);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  lVar6 = 0;
  do {
    if (this->_gfx[lVar6] == true) {
      uVar5 = 0xff;
      uVar4 = 0xff;
      uVar3 = 0xff;
    }
    else {
      uVar5 = 0;
      uVar4 = 0;
      uVar3 = 0;
    }
    SDL_SetRenderDrawColor(this->_renderer,uVar5,uVar4,uVar3,0xff);
    SDL_RenderFillRect(this->_renderer);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x800);
  this->_dirty_buffer = false;
  SDL_RenderPresent(this->_renderer);
  return;
}

Assistant:

void Graphics::refresh() {
        if (SDL_RenderClear(_renderer) != 0) {
            std::cout << "[graphics] clear error: " << SDL_GetError() << std::endl;
        }

        for (int pixel = 0; pixel < kGraphicsWidth * kGraphicsHeight; pixel++) {

            SDL_Rect scaled_pixel = {
                (pixel % kGraphicsWidth) * kGraphicsScale,
                (pixel / kGraphicsWidth) * kGraphicsScale,
                kGraphicsScale,
                kGraphicsScale
            };

            if (_gfx[pixel]) {
                SDL_SetRenderDrawColor(_renderer, 255, 255, 255, 255);
            } else {
                SDL_SetRenderDrawColor(_renderer, 0, 0, 0, 255);
            }

            SDL_RenderFillRect(_renderer, &scaled_pixel);
        }

        _dirty_buffer = false;

        SDL_RenderPresent(_renderer);
    }